

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_ary.c
# Opt level: O3

FIOBJ fiobj_ary_new(void)

{
  undefined1 *puVar1;
  size_t len;
  ulong uVar2;
  
  len = 0x28;
  puVar1 = (undefined1 *)fio_malloc(0x28);
  if (puVar1 != (undefined1 *)0x0) {
    *puVar1 = 0x29;
    *(undefined2 *)(puVar1 + 1) = 0;
    puVar1[3] = 0;
    *(undefined4 *)(puVar1 + 4) = 1;
    *(undefined8 *)(puVar1 + 8) = 0;
    *(undefined8 *)(puVar1 + 0x10) = 0;
    *(undefined8 *)(puVar1 + 0x18) = 0;
    *(undefined8 *)(puVar1 + 0x20) = 0;
    return (FIOBJ)puVar1;
  }
  fiobj_ary_new_cold_1();
  uVar2 = 0x28;
  puVar1 = (undefined1 *)fio_malloc(0x28);
  if (puVar1 != (undefined1 *)0x0) {
    *puVar1 = 0x29;
    *(undefined2 *)(puVar1 + 1) = 0;
    puVar1[3] = 0;
    *(undefined4 *)(puVar1 + 4) = 1;
    *(undefined8 *)(puVar1 + 8) = 0;
    *(undefined8 *)(puVar1 + 0x10) = 0;
    *(undefined8 *)(puVar1 + 0x18) = 0;
    *(undefined8 *)(puVar1 + 0x20) = 0;
    if (len != 0) {
      fio_ary_____require_on_top((fio_ary___s *)(puVar1 + 8),len);
    }
    return (FIOBJ)puVar1;
  }
  fiobj_ary_new2_cold_1();
  if (uVar2 != 0) {
    if ((((~(uint)uVar2 & 6) != 0) && ((uVar2 & 1) == 0)) &&
       (*(char *)(uVar2 & 0xfffffffffffffff8) == ')')) {
      return *(FIOBJ *)(uVar2 + 0x18);
    }
  }
  __assert_fail("ary && FIOBJ_TYPE_IS(ary, FIOBJ_T_ARRAY)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fiobj/fiobj_ary.c"
                ,0x6e,"size_t fiobj_ary_capa(FIOBJ)");
}

Assistant:

FIOBJ fiobj_ary_new(void) { return fiobj_ary_alloc(0); }